

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::(anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *masks,bool return_success,
          StringPiece has_bits_var)

{
  LogMessage *other;
  undefined7 in_register_00000009;
  AlphaNum *b;
  char *__rhs;
  AlphaNum *pAVar1;
  AlphaNum *c;
  Hex hex;
  AlphaNum *in_stack_fffffffffffffd98;
  char local_25c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  LogMessage local_228;
  string m;
  AlphaNum local_1d0;
  string result;
  AlphaNum local_170;
  AlphaNum local_140;
  AlphaNum local_110;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pAVar1 = (AlphaNum *)0x0;
  c = (AlphaNum *)has_bits_var.ptr_;
  while( true ) {
    b = (AlphaNum *)(*(long *)(this + 8) - *(long *)this >> 2);
    if (b <= pAVar1) break;
    hex.value = (ulong)*(uint *)(*(long *)this + (long)pAVar1 * 4);
    if (hex.value != 0) {
      local_228._0_8_ = "0x";
      local_228.filename_ = (char *)0x2;
      hex._8_8_ = 8;
      strings::AlphaNum::AlphaNum(&local_170,hex);
      StrCat_abi_cxx11_(&m,(protobuf *)&local_228,&local_170,b);
      local_228._0_8_ = "((";
      local_228.filename_ = (char *)0x2;
      local_140.piece_data_ = "[";
      local_140.piece_size_ = 1;
      local_170.piece_data_ = (char *)CONCAT71(in_register_00000009,return_success);
      local_170.piece_size_ = (size_t)has_bits_var.ptr_;
      strings::AlphaNum::AlphaNum((AlphaNum *)&result,(int)pAVar1);
      local_1d0.piece_data_ = "] & ";
      local_1d0.piece_size_ = 4;
      local_80.piece_data_ = m._M_dataplus._M_p;
      local_80.piece_size_ = m._M_string_length;
      local_b0.piece_data_ = ") ^ ";
      local_b0.piece_size_ = 4;
      local_e0.piece_data_ = m._M_dataplus._M_p;
      local_e0.piece_size_ = m._M_string_length;
      local_110.piece_data_ = ")";
      local_110.piece_size_ = 1;
      c = (AlphaNum *)&result;
      StrCat_abi_cxx11_(&local_50,(protobuf *)&local_228,&local_170,&local_140,(AlphaNum *)&result,
                        &local_1d0,&local_80,&local_b0,&local_e0,&local_110,
                        in_stack_fffffffffffffd98);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parts,
                 &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&m);
    }
    pAVar1 = (AlphaNum *)((long)&pAVar1->piece_data_ + 1);
  }
  if (parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      parts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    b = (AlphaNum *)0x60;
    internal::LogMessage::LogMessage
              (&local_228,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x60);
    other = internal::LogMessage::operator<<(&local_228,"CHECK failed: !parts.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_170,other);
    internal::LogMessage::~LogMessage(&local_228);
  }
  if ((long)parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)parts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    std::__cxx11::string::string
              ((string *)&result,
               (string *)
               parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    local_228._0_8_ = "(";
    local_228.filename_ = (char *)0x1;
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&local_1d0,(protobuf *)&parts,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)"\n       | ",(char *)b);
    local_170.piece_data_ = local_1d0.piece_data_;
    local_170.piece_size_ = local_1d0.piece_size_;
    local_140.piece_data_ = ")";
    local_140.piece_size_ = 1;
    StrCat_abi_cxx11_(&result,(protobuf *)&local_228,&local_170,&local_140,c);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  __rhs = " != 0";
  local_25c = (char)masks;
  if (local_25c != '\0') {
    __rhs = " == 0";
  }
  std::operator+(__return_storage_ptr__,&result,__rhs);
  std::__cxx11::string::~string((string *)&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  return __return_storage_ptr__;
}

Assistant:

std::string ConditionalToCheckBitmasks(
    const std::vector<uint32_t>& masks, bool return_success = true,
    StringPiece has_bits_var = "_has_bits_") {
  std::vector<std::string> parts;
  for (int i = 0; i < masks.size(); i++) {
    if (masks[i] == 0) continue;
    std::string m = StrCat("0x", strings::Hex(masks[i], strings::ZERO_PAD_8));
    // Each xor evaluates to 0 if the expected bits are present.
    parts.push_back(
        StrCat("((", has_bits_var, "[", i, "] & ", m, ") ^ ", m, ")"));
  }
  GOOGLE_CHECK(!parts.empty());
  // If we have multiple parts, each expected to be 0, then bitwise-or them.
  std::string result =
      parts.size() == 1
          ? parts[0]
          : StrCat("(", Join(parts, "\n       | "), ")");
  return result + (return_success ? " == 0" : " != 0");
}